

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O2

void __thiscall HEkk::computeDualObjectiveValue(HEkk *this,HighsInt phase)

{
  pointer pcVar1;
  pointer pdVar2;
  pointer pdVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  
  uVar6 = 0;
  HighsSimplexAnalysis::simplexTimerStart(&this->analysis_,0x23,0);
  (this->info_).dual_objective_value = 0.0;
  uVar4 = (this->lp_).num_row_ + (this->lp_).num_col_;
  pcVar1 = (this->basis_).nonbasicFlag_.
           super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (this->info_).workValue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (this->info_).workDual_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar5 = uVar6;
  }
  dVar7 = 0.0;
  for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    if (pcVar1[uVar6] != '\0') {
      dVar8 = pdVar3[uVar6] * pdVar2[uVar6];
      if ((dVar8 != 0.0) || (NAN(dVar8))) {
        dVar7 = dVar7 + dVar8;
        (this->info_).dual_objective_value = dVar7;
      }
    }
  }
  dVar7 = dVar7 * this->cost_scale_;
  (this->info_).dual_objective_value = dVar7;
  if (phase != 1) {
    (this->info_).dual_objective_value = (double)(this->lp_).sense_ * (this->lp_).offset_ + dVar7;
  }
  (this->status_).has_dual_objective_value = true;
  HighsSimplexAnalysis::simplexTimerStop(&this->analysis_,0x23,0);
  return;
}

Assistant:

void HEkk::computeDualObjectiveValue(const HighsInt phase) {
  analysis_.simplexTimerStart(ComputeDuObjClock);
  info_.dual_objective_value = 0;
  const HighsInt num_tot = lp_.num_col_ + lp_.num_row_;
  for (HighsInt iCol = 0; iCol < num_tot; iCol++) {
    if (basis_.nonbasicFlag_[iCol]) {
      const double term = info_.workValue_[iCol] * info_.workDual_[iCol];
      if (term) {
        info_.dual_objective_value +=
            info_.workValue_[iCol] * info_.workDual_[iCol];
      }
    }
  }
  info_.dual_objective_value *= cost_scale_;
  if (phase != 1) {
    // In phase 1 the dual objective has no objective
    // shift. Otherwise, if minimizing the shift is added. If
    // maximizing, workCost (and hence workDual) are negated, so the
    // shift is subtracted. Hence the shift is added according to the
    // sign implied by sense_
    info_.dual_objective_value += ((HighsInt)lp_.sense_) * lp_.offset_;
  }
  // Now have dual objective value
  status_.has_dual_objective_value = true;
  analysis_.simplexTimerStop(ComputeDuObjClock);
}